

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O0

void sx__coro_return(sx_coro_context *ctx,sx_fiber_t *pfrom,sx_coro_ret_type type,int arg)

{
  sx__coro_state *node;
  code *pcVar1;
  sx_fiber_transfer sVar2;
  sx_fiber_t local_38;
  sx__coro_state *fs;
  int arg_local;
  sx_coro_ret_type type_local;
  sx_fiber_t *pfrom_local;
  sx_coro_context *ctx_local;
  
  if (ctx->cur_coro == (sx__coro_state *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",
                      0x135,
                      "You must call this function from within sx_fiber_cb invoked by sx_fiber_invoke"
                     );
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  if (type != CORO_RET_NONE) {
    node = ctx->cur_coro;
    if (type == CORO_RET_END) {
      sx__coro_remove_list(&ctx->run_list,&ctx->run_list_last,node);
      sx_pool_del(ctx->coro_pool,node);
    }
    else {
      node->ret_state = type;
      (node->counter).tm = 0.0;
      if (type == CORO_RET_WAIT) {
        (node->arg).tm = (float)arg * 0.001;
      }
      else if (type == CORO_RET_YIELD) {
        (node->arg).n = arg;
      }
    }
    ctx->cur_coro = (sx__coro_state *)0x0;
    sVar2 = sx_fiber_switch(*pfrom,(void *)0x0);
    local_38 = sVar2.from;
    *pfrom = local_38;
    return;
  }
  sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",
                    0x136,"Invalid enum for type");
  pcVar1 = (code *)swi(3);
  (*pcVar1)();
  return;
}

Assistant:

static inline void sx__coro_return(sx_coro_context* ctx, sx_fiber_t* pfrom, sx_coro_ret_type type,
                                   int arg)
{
    sx_assertf(ctx->cur_coro,
              "You must call this function from within sx_fiber_cb invoked by sx_fiber_invoke");
    sx_assertf(type != CORO_RET_NONE, "Invalid enum for type");

    sx__coro_state* fs = ctx->cur_coro;

    // If fiber is finished, just remove it from the list
    if (type == CORO_RET_END) {
        sx__coro_remove_list(&ctx->run_list, &ctx->run_list_last, fs);
        sx_pool_del(ctx->coro_pool, fs);
    } else {
        fs->ret_state = type;
        fs->counter.n = 0;
        if (type == CORO_RET_WAIT)
            fs->arg.tm = ((float)arg) * 0.001f;    // Convert msecs to seconds
        else if (type == CORO_RET_YIELD)
            fs->arg.n = arg;    // Number of next update passes
    }

    ctx->cur_coro = NULL;
    *pfrom = sx_fiber_switch(*pfrom, NULL).from;
}